

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_node_check_utf8(mpack_node_t node)

{
  _Bool _Var1;
  mpack_error_t mVar2;
  char *str;
  mpack_node_data_t *data;
  mpack_node_t node_local;
  
  mVar2 = mpack_node_error(node);
  if (mVar2 == mpack_ok) {
    if ((node.data)->type == mpack_type_str) {
      str = mpack_node_data_unchecked(node);
      _Var1 = mpack_utf8_check(str,(ulong)(node.data)->len);
      if (_Var1) {
        return;
      }
    }
    mpack_node_flag_error(node,mpack_error_type);
  }
  return;
}

Assistant:

void mpack_node_check_utf8(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return;
    mpack_node_data_t* data = node.data;
    if (data->type != mpack_type_str || !mpack_utf8_check(mpack_node_data_unchecked(node), data->len))
        mpack_node_flag_error(node, mpack_error_type);
}